

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  undefined8 uVar3;
  ostream *poVar4;
  int r;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  SesquickselectK2<long_double> *local_118;
  string filename;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_118 = (SesquickselectK2<long_double> *)operator_new(0x20);
  (local_118->super_QuickselectParams<long_double>)._vptr_QuickselectParams = (_func_int **)0x0;
  *(undefined8 *)&local_118->field_0x8 = 0;
  *(undefined8 *)&local_118->nuStar = 0;
  *(undefined8 *)((long)&local_118->nuStar + 8) = 0;
  (local_118->super_QuickselectParams<long_double>)._vptr_QuickselectParams =
       (_func_int **)&PTR_partitioningCosts_00107d58;
  local_118->nuStar = (longdouble)0.265716848;
  SesquickselectK2<long_double>::name_abi_cxx11_(&local_50,local_118);
  std::operator+(&local_90,&local_50,"-samples");
  std::__cxx11::to_string(&local_b0,200);
  std::operator+(&local_70,&local_90,&local_b0);
  std::operator+(&local_178,&local_70,"-iter");
  std::__cxx11::to_string(&local_d0,0x32);
  std::operator+(&local_158,&local_178,&local_d0);
  std::operator+(&local_138,&local_158,"-init");
  std::__cxx11::to_string(&local_f0,1.0);
  std::operator+(&filename,&local_138,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  local_138._0_10_ = (BADTYPE)1;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)&local_158,200,
             (value_type_conflict2 *)&local_138,(allocator_type *)&local_178);
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)&local_178,200,
             (allocator_type *)&local_138);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&filename);
  std::endl<char,std::char_traits<char>>(poVar4);
  for (iVar5 = 1; iVar5 != 0x33; iVar5 = iVar5 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Running Iteration ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    poVar4 = std::operator<<(poVar4," ...");
    std::endl<char,std::char_traits<char>>(poVar4);
    integralEquationIteration<long_double>
              (&local_118->super_QuickselectParams<long_double>,
               (vector<long_double,_std::allocator<long_double>_> *)&local_158,
               (vector<long_double,_std::allocator<long_double>_> *)&local_178);
    uVar3 = local_158.field_2._M_allocated_capacity;
    sVar2 = local_158._M_string_length;
    _Var1._M_p = local_158._M_dataplus._M_p;
    local_158.field_2._M_allocated_capacity = local_178.field_2._M_allocated_capacity;
    local_158._M_dataplus._M_p = local_178._M_dataplus._M_p;
    local_158._M_string_length = local_178._M_string_length;
    local_178._M_dataplus._M_p = _Var1._M_p;
    local_178._M_string_length = sVar2;
    local_178.field_2._M_allocated_capacity = uVar3;
    printXYAsMathematicaList<long_double>
              ((vector<long_double,_std::allocator<long_double>_> *)&local_178);
  }
  std::operator+(&local_138,&filename,".tab");
  writeXYtoTableFile<long_double>
            ((vector<long_double,_std::allocator<long_double>_> *)&local_178,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
            ((_Vector_base<long_double,_std::allocator<long_double>_> *)&local_178);
  std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
            ((_Vector_base<long_double,_std::allocator<long_double>_> *)&local_158);
  std::__cxx11::string::~string((string *)&filename);
  return 0;
}

Assistant:

int main() {
	unsigned int nSamples = 200;
	unsigned int nIterations = 50;
	double initValue = 1;

	// SELECT ALGORITHM HERE
	// default: sesquickselect with optimal cutoff, costs are scanned elements
	QuickselectParams<num> * pParams = new SesquickselectK2<num> {};

	string filename = pParams->name()
	                  + "-samples" + to_string(nSamples)
	                  + "-iter" + to_string(nIterations)
	                  + "-init" + to_string(initValue);
	vector<num> fOld(nSamples, initValue), f(nSamples);
	std::cout << filename << std::endl;
	for (int r = 1; r <= nIterations; ++r) {
		cout << "Running Iteration " << r << " ..." << endl;
		integralEquationIteration(pParams, fOld, f);
		swap(fOld, f); // yes, expensive copy, but s dominated by above computations anyway ...
		printXYAsMathematicaList(f);
	}
	writeXYtoTableFile(f, filename + ".tab");

	return 0;
}